

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_decompress.c
# Opt level: O1

size_t ZSTD_DCtx_reset(ZSTD_DCtx *dctx,ZSTD_ResetDirective reset)

{
  if ((reset & ~ZSTD_reset_parameters) == ZSTD_reset_session_only) {
    dctx->streamStage = zdss_init;
    dctx->noForwardProgress = 0;
    ZSTD_freeDDict(dctx->ddictLocal);
    dctx->ddictLocal = (ZSTD_DDict *)0x0;
    dctx->ddict = (ZSTD_DDict *)0x0;
  }
  if ((reset & ~ZSTD_reset_session_only) == ZSTD_reset_parameters) {
    if (dctx->streamStage != zdss_init) {
      return 0xffffffffffffffc4;
    }
    dctx->format = ZSTD_f_zstd1;
    dctx->maxWindowSize = 0x8000001;
  }
  return 0;
}

Assistant:

size_t ZSTD_DCtx_reset(ZSTD_DCtx* dctx, ZSTD_ResetDirective reset)
{
    if ( (reset == ZSTD_reset_session_only)
      || (reset == ZSTD_reset_session_and_parameters) ) {
        (void)ZSTD_initDStream(dctx);
    }
    if ( (reset == ZSTD_reset_parameters)
      || (reset == ZSTD_reset_session_and_parameters) ) {
        if (dctx->streamStage != zdss_init)
            return ERROR(stage_wrong);
        dctx->format = ZSTD_f_zstd1;
        dctx->maxWindowSize = ZSTD_MAXWINDOWSIZE_DEFAULT;
    }
    return 0;
}